

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringClass.cpp
# Opt level: O3

char * dirname(char *__path)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  String *in_RSI;
  char *pcVar4;
  
  uVar3 = String::lastIndexOf(in_RSI,"/",-1);
  if ((int)uVar3 < 1) {
    cVar1 = *(in_RSI->_string)._M_dataplus._M_p;
    *(char **)__path = __path + 0x10;
    if (cVar1 == '/') {
      pcVar4 = "/";
      pcVar2 = "/";
    }
    else {
      pcVar2 = "\t";
      pcVar4 = "";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)__path,pcVar4,pcVar2 + 1);
  }
  else {
    String::mid((String *)__path,in_RSI,0,(ulong)uVar3);
  }
  return __path;
}

Assistant:

String dirname (String const& path)
{
	int lastpos = path.lastIndexOf (DIRSLASH);

	if (lastpos > 0)
		return path.mid (0, lastpos);

#ifndef _WIN32
	if (path[0] == '/')
		return "/";
#endif // _WIN32

	return "";
}